

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

void __thiscall
tchecker::clock_updates_visitor_t::update_int_to_clock_outside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,
          shared_ptr<const_tchecker::expression_t> *c)

{
  range_t<unsigned_int,_unsigned_int> rVar1;
  clock_updates_list_t *pcVar2;
  uint uVar3;
  clock_id_t z;
  clock_id_t x_00;
  clock_update_t x_upd;
  clock_update_t cStack_38;
  
  rVar1 = extract_lvalue_variable_ids(x);
  clock_update_t::clock_update_t(&cStack_38,0x7fffffff,c);
  uVar3 = rVar1._end;
  if (uVar3 - rVar1._begin == 1) {
    pcVar2 = clock_updates_map_t::operator[](&this->_u,rVar1._begin);
    clock_updates_list_t::set(pcVar2,&cStack_38);
  }
  else {
    while (x_00 = rVar1._begin, uVar3 != x_00) {
      pcVar2 = clock_updates_map_t::operator[](&this->_u,x_00);
      clock_updates_list_t::absorbing_push_back(pcVar2,&cStack_38);
      rVar1._begin = x_00 + 1;
      rVar1._end = 0;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cStack_38._value.
              super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void update_int_to_clock_outside_loop(tchecker::typed_lvalue_expression_t const & x,
                                        std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    tchecker::clock_update_t x_upd{tchecker::REFCLOCK_ID, c};
    if (single_instance(x_instances)) {
      tchecker::clock_id_t z = x_instances.begin();
      _u[z].set(x_upd);
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_push_back(x_upd);
    }
  }